

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rbuObjIterFreeCols(RbuObjIter *pIter)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 < pIter->nTblCol; lVar1 = lVar1 + 1) {
    sqlite3_free(pIter->azTblCol[lVar1]);
    sqlite3_free(pIter->azTblType[lVar1]);
  }
  sqlite3_free(pIter->azTblCol);
  pIter->nTblCol = 0;
  pIter->eType = 0;
  pIter->aiSrcOrder = (int *)0x0;
  pIter->abTblPk = (u8 *)0x0;
  pIter->azTblCol = (char **)0x0;
  pIter->azTblType = (char **)0x0;
  pIter->abNotNull = (u8 *)0x0;
  return;
}

Assistant:

static void rbuObjIterFreeCols(RbuObjIter *pIter){
  int i;
  for(i=0; i<pIter->nTblCol; i++){
    sqlite3_free(pIter->azTblCol[i]);
    sqlite3_free(pIter->azTblType[i]);
  }
  sqlite3_free(pIter->azTblCol);
  pIter->azTblCol = 0;
  pIter->azTblType = 0;
  pIter->aiSrcOrder = 0;
  pIter->abTblPk = 0;
  pIter->abNotNull = 0;
  pIter->nTblCol = 0;
  pIter->eType = 0;               /* Invalid value */
}